

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O2

int32_t icu_63::number::impl::NumberFormatterImpl::writeIntegerDigits
                  (MicroProps *micros,DecimalQuantity *quantity,NumberStringBuilder *string,
                  int32_t index,UErrorCode *status)

{
  bool bVar1;
  int8_t digit;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int position;
  UnicodeString local_70;
  
  iVar2 = DecimalQuantity::getUpperDisplayMagnitude(quantity);
  iVar4 = 0;
  for (position = 0; position <= iVar2; position = position + 1) {
    bVar1 = Grouper::groupAtPosition(&micros->grouping,position,quantity);
    if (bVar1) {
      UnicodeString::UnicodeString
                (&local_70,
                 (UnicodeString *)
                 (&micros->symbols->field_0x48 + (ulong)micros->useCurrency * 0x400));
      iVar3 = NumberStringBuilder::insert
                        (string,index,&local_70,UNUM_GROUPING_SEPARATOR_FIELD,status);
      iVar4 = iVar4 + iVar3;
      UnicodeString::~UnicodeString(&local_70);
    }
    digit = DecimalQuantity::getDigit(quantity,position);
    iVar3 = utils::insertDigitFromSymbols
                      (string,index,digit,micros->symbols,UNUM_INTEGER_FIELD,status);
    iVar4 = iVar4 + iVar3;
  }
  return iVar4;
}

Assistant:

int32_t NumberFormatterImpl::writeIntegerDigits(const MicroProps& micros, DecimalQuantity& quantity,
                                                NumberStringBuilder& string, int32_t index,
                                                UErrorCode& status) {
    int length = 0;
    int integerCount = quantity.getUpperDisplayMagnitude() + 1;
    for (int i = 0; i < integerCount; i++) {
        // Add grouping separator
        if (micros.grouping.groupAtPosition(i, quantity)) {
            length += string.insert(
                    index,
                    micros.useCurrency ? micros.symbols->getSymbol(
                            DecimalFormatSymbols::ENumberFormatSymbol::kMonetaryGroupingSeparatorSymbol)
                                       : micros.symbols->getSymbol(
                            DecimalFormatSymbols::ENumberFormatSymbol::kGroupingSeparatorSymbol),
                    UNUM_GROUPING_SEPARATOR_FIELD,
                    status);
        }

        // Get and append the next digit value
        int8_t nextDigit = quantity.getDigit(i);
        length += utils::insertDigitFromSymbols(
                string, index, nextDigit, *micros.symbols, UNUM_INTEGER_FIELD, status);
    }
    return length;
}